

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::ParseSymbolTable(LoadCommand *cmd,RangeSink *sink)

{
  string_view data;
  string_view data_00;
  string_view file_range;
  string_view file_range_00;
  string_view name;
  string_view name_00;
  char *in_RSI;
  long in_RDI;
  string_view sVar1;
  size_t size;
  symtab_command *symtab;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff98;
  RangeSink *this;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_stack_ffffffffffffffc0;
  
  sVar1._M_str = in_stack_ffffffffffffff60;
  sVar1._M_len = in_stack_ffffffffffffff58;
  GetStructPointer<symtab_command>(sVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this = *(RangeSink **)(in_RDI + 0x18);
  sVar2 = *(size_t *)(in_RDI + 0x20);
  data._M_str = in_stack_ffffffffffffff80;
  data._M_len = in_stack_ffffffffffffff78;
  sVar1 = StrictSubstr(data,(size_t)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  pcVar3 = (char *)sVar1._M_len;
  pcVar4 = sVar1._M_str;
  name._M_str = in_stack_ffffffffffffffc0;
  name._M_len = (size_t)pcVar4;
  file_range._M_str = pcVar3;
  file_range._M_len = sVar2;
  RangeSink::AddFileRange(this,in_stack_ffffffffffffff98,name,file_range);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff70,in_RSI);
  data_00._M_str = in_stack_ffffffffffffff80;
  data_00._M_len = *(size_t *)(in_RDI + 0x20);
  StrictSubstr(data_00,*(size_t *)(in_RDI + 0x18),(size_t)in_RSI);
  name_00._M_str = in_stack_ffffffffffffffc0;
  name_00._M_len = (size_t)pcVar4;
  file_range_00._M_str = pcVar3;
  file_range_00._M_len = sVar2;
  RangeSink::AddFileRange(this,in_stack_ffffffffffffff98,name_00,file_range_00);
  return;
}

Assistant:

static void ParseSymbolTable(const LoadCommand& cmd, RangeSink* sink) {
  auto symtab = GetStructPointer<symtab_command>(cmd.command_data);

  size_t size = cmd.is64bit ? sizeof(nlist_64) : sizeof(struct nlist);
  sink->AddFileRange(
      "macho_symtab", "Symbol Table",
      StrictSubstr(cmd.file_data, symtab->symoff, symtab->nsyms * size));
  sink->AddFileRange(
      "macho_symtab", "String Table",
      StrictSubstr(cmd.file_data, symtab->stroff, symtab->strsize));
}